

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  long lVar10;
  uint64_t uVar11;
  uint16_t *puVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  size_t sVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  size_t *psVar21;
  BrotliTransforms *pBVar22;
  uint8_t *puVar23;
  size_t sVar24;
  byte bVar25;
  long lVar26;
  ulong uVar27;
  char *pcVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  int *piVar37;
  ulong uVar38;
  ushort uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  int iVar45;
  size_t *psVar46;
  size_t *psVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  uint32_t *buckets;
  ulong uVar51;
  int last_distance;
  ulong uVar52;
  uint uVar53;
  uint uVar54;
  uint8_t *puVar55;
  size_t sVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  size_t local_150;
  size_t local_148;
  ulong local_140;
  ulong local_138;
  ulong local_110;
  ulong local_f0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  size_t *local_b0;
  
  bVar25 = literal_context_lut[8];
  lVar10 = *(long *)(literal_context_lut + 0x10);
  local_f0 = *(ulong *)dist_cache;
  uVar2 = position + num_bytes;
  uVar20 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar20 = position;
  }
  lVar26 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar26 = 0x40;
  }
  iVar31 = *(int *)&(params->dictionary).words;
  if (4 < iVar31) {
    iVar29 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar29 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar29 + 1;
    (hasher->common).params.type = iVar29 + -2;
    (hasher->common).params.bucket_bits = iVar29 + 2;
    (hasher->common).params.block_bits = iVar29 + -3;
    (hasher->common).params.hash_len = iVar29 + 3;
    if (10 < iVar31) {
      iVar31 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar31 + -1;
      (hasher->common).is_prepared_ = iVar31 + 1;
      *(int *)&hasher->privat = iVar31 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar31 + 2;
      *(int *)((long)&hasher->privat + 8) = iVar31 + -3;
      *(int *)((long)&hasher->privat + 0xc) = iVar31 + 3;
    }
  }
  if (position + 8 < uVar2) {
    uVar4 = (1L << (bVar25 & 0x3f)) - 0x10;
    local_c8 = lVar26 + position;
    uVar1 = uVar2 - 7;
    lVar3 = position - 1;
    local_b0 = last_insert_len;
    do {
      uVar44 = uVar4;
      if (position < uVar4) {
        uVar44 = position;
      }
      uVar43 = lVar10 + position;
      if (uVar4 <= lVar10 + position) {
        uVar43 = uVar4;
      }
      uVar40 = *(ulong *)(literal_context_lut + 0x50);
      uVar11 = (params->dictionary).cutoffTransforms;
      puVar12 = (params->dictionary).hash_table_words;
      psVar47 = *(size_t **)backward_references;
      bVar60 = psVar47 < back_refs_position;
      if ((bVar60) && ((ulong)(long)(int)num_literals[(long)psVar47 * 2] < position)) {
        psVar21 = num_literals + (long)psVar47 * 2 + 2;
        psVar46 = psVar47;
        do {
          psVar46 = (size_t *)((long)psVar46 + 1);
          psVar47 = back_refs_position;
          if (back_refs_position == psVar46) break;
          sVar17 = *psVar21;
          psVar21 = psVar21 + 2;
          psVar47 = psVar46;
        } while ((ulong)(long)(int)sVar17 < position);
        *(size_t **)backward_references = psVar46;
        bVar60 = psVar46 < back_refs_position;
      }
      local_d8 = uVar2 - position;
      uVar32 = position & ringbuffer_mask;
      if ((bVar60) && (position == (long)(int)num_literals[(long)psVar47 * 2])) {
        uVar30 = (uint)num_literals[(long)psVar47 * 2 + 1];
        local_140 = (ulong)(int)uVar30;
        local_110 = 0x7e4;
        iVar31 = 0;
        bVar16 = true;
        if ((position - local_140 < position) &&
           (uVar30 <= *(uint *)((long)num_literals + (long)psVar47 * 0x10 + 0xc))) {
          uVar52 = position - local_140 & ringbuffer_mask;
          if (7 < local_d8) {
            uVar33 = local_d8 & 0xfffffffffffffff8;
            puVar23 = ringbuffer + uVar33 + uVar32;
            lVar50 = 0;
            uVar59 = 0;
LAB_001160ee:
            uVar36 = *(ulong *)(ringbuffer + uVar32 + uVar59 * 8);
            if (uVar36 == *(ulong *)(ringbuffer + uVar59 * 8 + uVar52)) goto code_r0x001160fb;
            uVar36 = *(ulong *)(ringbuffer + uVar59 * 8 + uVar52) ^ uVar36;
            uVar52 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            uVar59 = (uVar52 >> 3 & 0x1fffffff) - lVar50;
            goto LAB_00116153;
          }
          uVar33 = 0;
          puVar23 = ringbuffer + uVar32;
LAB_001165ec:
          uVar36 = local_d8 & 7;
          uVar59 = uVar33;
          if (uVar36 != 0) {
            uVar58 = uVar33 | uVar36;
            do {
              uVar59 = uVar33;
              if (ringbuffer[uVar33 + uVar52] != *puVar23) break;
              puVar23 = puVar23 + 1;
              uVar33 = uVar33 + 1;
              uVar36 = uVar36 - 1;
              uVar59 = uVar58;
            } while (uVar36 != 0);
          }
LAB_00116153:
          sVar56 = (size_t)*(int *)((long)num_literals + (long)psVar47 * 0x10 + 4);
          if (uVar59 < sVar56) {
            sVar56 = uVar59;
          }
          iVar29 = 0x1f;
          if (uVar30 != 0) {
            for (; uVar30 >> iVar29 == 0; iVar29 = iVar29 + -1) {
            }
          }
          local_110 = (ulong)(iVar29 * -0x1e + 0x780) + sVar56 * 0x87;
          bVar15 = true;
          bVar16 = false;
        }
        else {
          bVar15 = false;
          local_140 = 0;
          sVar56 = 0;
        }
        local_148 = sVar56;
        if (bVar16) goto LAB_00114fc9;
      }
      else {
        uVar52 = (ulong)*(int *)&(params->dictionary).words;
        if (uVar52 == 0) {
          local_110 = 0x7e4;
          local_140 = 0;
          local_148 = 0;
          uVar33 = 0;
        }
        else {
          puVar23 = ringbuffer + uVar32;
          uVar36 = (ulong)((uint)local_d8 & 7);
          local_110 = 0x7e4;
          uVar33 = 0;
          uVar59 = 0;
          local_148 = 0;
          local_140 = 0;
          do {
            uVar58 = (ulong)*(int *)((long)&(hasher->common).extra + uVar59 * 4);
            if (((uVar58 <= uVar44) && (position - uVar58 < position)) &&
               (uVar32 + uVar33 <= ringbuffer_mask)) {
              uVar38 = position - uVar58 & ringbuffer_mask;
              if ((uVar38 + uVar33 <= ringbuffer_mask) &&
                 (ringbuffer[uVar32 + uVar33] == ringbuffer[uVar38 + uVar33])) {
                if (7 < local_d8) {
                  lVar50 = 0;
                  uVar41 = 0;
LAB_00114bc4:
                  if (*(ulong *)(puVar23 + uVar41 * 8) ==
                      *(ulong *)(ringbuffer + uVar41 * 8 + uVar38)) goto code_r0x00114bd9;
                  uVar41 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar38) ^
                           *(ulong *)(puVar23 + uVar41 * 8);
                  uVar38 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar41 = (uVar38 >> 3 & 0x1fffffff) - lVar50;
                  goto LAB_00114c39;
                }
                uVar48 = 0;
                puVar55 = puVar23;
LAB_00114cec:
                uVar41 = uVar48;
                if (uVar36 != 0) {
                  uVar34 = uVar36 | uVar48;
                  uVar27 = uVar36;
                  do {
                    uVar41 = uVar48;
                    if (ringbuffer[uVar48 + uVar38] != *puVar55) break;
                    puVar55 = puVar55 + 1;
                    uVar48 = uVar48 + 1;
                    uVar27 = uVar27 - 1;
                    uVar41 = uVar34;
                  } while (uVar27 != 0);
                }
LAB_00114c39:
                if ((bVar60) &&
                   ((ulong)(long)(int)num_literals[(long)psVar47 * 2] < uVar41 + position)) {
                  uVar41 = (long)(int)num_literals[(long)psVar47 * 2] - position;
                }
                if (((2 < uVar41) || ((uVar59 < 2 && (uVar41 == 2)))) &&
                   (uVar38 = uVar41 * 0x87 + 0x78f, local_110 < uVar38)) {
                  if (uVar59 != 0) {
                    uVar38 = uVar38 - ((0x1ca10U >> ((byte)uVar59 & 0xe) & 0xe) + 0x27);
                  }
                  if (local_110 < uVar38) {
                    uVar33 = uVar41;
                    local_148 = uVar41;
                    local_140 = uVar58;
                    local_110 = uVar38;
                  }
                }
              }
            }
            uVar59 = uVar59 + 1;
          } while (uVar59 != uVar52);
        }
        uVar52._0_4_ = (params->dist).alphabet_size_max;
        uVar52._4_4_ = (params->dist).alphabet_size_limit;
        uVar52 = (*(ulong *)(ringbuffer + uVar32) & uVar52) * 0x1fe35a7bd3579bd3 >>
                 ((byte)(params->dist).distance_postfix_bits & 0x3f);
        uVar36 = uVar52 & 0xffffffff;
        uVar30 = (int)uVar52 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
        uVar5 = *(ushort *)(uVar11 + uVar36 * 2);
        uVar59 = (ulong)uVar5;
        piVar37 = &(params->hasher).num_last_distances_to_check;
        puVar23 = ringbuffer + uVar32;
        uVar52 = 0;
        if (*(ulong *)piVar37 <= uVar59) {
          uVar52 = uVar59 - *(long *)piVar37;
        }
        uVar58 = (ulong)((uint)local_d8 & 7);
        do {
          if (uVar59 <= uVar52) break;
          uVar59 = uVar59 - 1;
          uVar53 = *(uint *)(puVar12 +
                            (ulong)uVar30 * 2 +
                            (ulong)((uint)(params->dist).max_distance & (uint)uVar59) * 2);
          uVar38 = position - uVar53;
          if ((uVar38 <= uVar44) && (uVar32 + uVar33 <= ringbuffer_mask)) {
            uVar41 = (ulong)(uVar53 & (uint)ringbuffer_mask);
            if ((uVar41 + uVar33 <= ringbuffer_mask) &&
               (ringbuffer[uVar32 + uVar33] == ringbuffer[uVar41 + uVar33])) {
              if (7 < local_d8) {
                lVar50 = 0;
                uVar48 = 0;
LAB_00114e69:
                if (*(ulong *)(puVar23 + uVar48 * 8) == *(ulong *)(ringbuffer + uVar48 * 8 + uVar41)
                   ) goto code_r0x00114e7e;
                uVar48 = *(ulong *)(ringbuffer + uVar48 * 8 + uVar41) ^
                         *(ulong *)(puVar23 + uVar48 * 8);
                uVar41 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                  }
                }
                uVar48 = (uVar41 >> 3 & 0x1fffffff) - lVar50;
                goto LAB_00114ec3;
              }
              puVar55 = puVar23;
              uVar27 = 0;
LAB_00114f45:
              uVar48 = uVar27;
              if (uVar58 != 0) {
                uVar51 = uVar58 | uVar27;
                uVar34 = uVar58;
                do {
                  uVar48 = uVar27;
                  if (ringbuffer[uVar27 + uVar41] != *puVar55) break;
                  puVar55 = puVar55 + 1;
                  uVar27 = uVar27 + 1;
                  uVar34 = uVar34 - 1;
                  uVar48 = uVar51;
                } while (uVar34 != 0);
              }
LAB_00114ec3:
              if ((bVar60) &&
                 ((ulong)(long)(int)num_literals[(long)psVar47 * 2] < uVar48 + position)) {
                uVar48 = (long)(int)num_literals[(long)psVar47 * 2] - position;
              }
              if (3 < uVar48) {
                iVar31 = 0x1f;
                if ((uint)uVar38 != 0) {
                  for (; (uint)uVar38 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                  }
                }
                uVar41 = (ulong)(iVar31 * -0x1e + 0x780) + uVar48 * 0x87;
                if (local_110 < uVar41) {
                  uVar33 = uVar48;
                  local_148 = uVar48;
                  local_140 = uVar38;
                  local_110 = uVar41;
                }
              }
            }
          }
        } while (uVar38 <= uVar44);
        *(int *)(puVar12 +
                (ulong)uVar30 * 2 + (ulong)((uint)(params->dist).max_distance & (uint)uVar5) * 2) =
             (int)position;
        *(ushort *)(uVar11 + uVar36 * 2) = uVar5 + 1;
        bVar15 = false;
LAB_00114fc9:
        iVar31 = 0;
        sVar56 = local_148;
        if (local_110 == 0x7e4) {
          if (back_refs_position == (size_t *)0x0) {
            lVar50 = *(long *)&(params->dictionary).num_transforms;
            if (*(ulong *)(lVar50 + 8) >> 7 <= *(ulong *)(lVar50 + 0x10)) {
              piVar37 = (int *)(ringbuffer + uVar32);
              uVar44 = (ulong)((uint)(*piVar37 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              lVar13 = *(long *)(literal_context_lut + 0x78);
              lVar49 = *(long *)(lVar50 + 8);
              iVar31 = 0;
              lVar35 = 0;
LAB_00115ed1:
              lVar49 = lVar49 + 1;
              *(long *)(lVar50 + 8) = lVar49;
              bVar25 = *(byte *)(lVar13 + uVar44);
              uVar32 = (ulong)bVar25;
              if (uVar32 != 0) {
                bVar60 = true;
                if (uVar32 <= local_d8) {
                  uVar52 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar44 * 2);
                  lVar14 = *(long *)(literal_context_lut + 0x58);
                  pcVar28 = (char *)(uVar52 * uVar32 + *(long *)(lVar14 + 0xa8) +
                                    (ulong)*(uint *)(lVar14 + 0x20 + uVar32 * 4));
                  if (7 < bVar25) {
                    sVar56 = (size_t)(bVar25 & 0xfffffff8);
                    lVar57 = 0;
                    uVar33 = 0;
LAB_00115f44:
                    if (*(ulong *)(pcVar28 + uVar33 * 8) == *(ulong *)(piVar37 + uVar33 * 2))
                    goto code_r0x00115f56;
                    uVar59 = *(ulong *)(piVar37 + uVar33 * 2) ^ *(ulong *)(pcVar28 + uVar33 * 8);
                    uVar33 = 0;
                    if (uVar59 != 0) {
                      for (; (uVar59 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                      }
                    }
                    uVar33 = (uVar33 >> 3 & 0x1fffffff) - lVar57;
                    goto LAB_00115f94;
                  }
                  sVar56 = 0;
                  goto LAB_00116063;
                }
                goto LAB_00115fed;
              }
              goto LAB_00115ffd;
            }
          }
          else if ((bVar60) && (position == (long)(int)num_literals[(long)psVar47 * 2])) {
            uVar30 = (uint)num_literals[(long)psVar47 * 2 + 1];
            if (*(int *)((long)num_literals + (long)psVar47 * 0x10 + 0xc) < (int)uVar30) {
              uVar53 = *(uint *)((long)num_literals + (long)psVar47 * 0x10 + 4);
              uVar43 = (ulong)uVar53;
              if (uVar53 - 4 < 0x15 && (int)uVar30 < 0x7ffffffd) {
                uVar54 = ~(uint)uVar44 + uVar30;
                lVar50 = *(long *)(literal_context_lut + 0x58);
                iVar29 = (int)uVar54 >> (*(byte *)(lVar50 + uVar43) & 0x1f);
                if (iVar29 < *(int *)(literal_context_lut + 0x60)) {
                  uVar6 = *(uint *)(lVar50 + 0x20 + uVar43 * 4);
                  uVar7 = kBitMask[*(byte *)(lVar50 + uVar43)];
                  lVar50 = *(long *)(lVar50 + 0xa8);
                  pBVar22 = BrotliGetTransforms();
                  puVar23 = (uint8_t *)malloc(uVar43 * 10);
                  iVar29 = BrotliTransformDictionaryWord
                                     (puVar23,(uint8_t *)
                                              ((ulong)uVar6 + lVar50 +
                                              (long)(int)((uVar54 & uVar7) * uVar53)),uVar53,pBVar22
                                      ,iVar29);
                  sVar56 = (size_t)iVar29;
                  iVar19 = bcmp(ringbuffer + uVar32,puVar23,sVar56);
                  if (iVar19 == 0) {
                    iVar31 = 0x1f;
                    if (uVar30 != 0) {
                      for (; uVar30 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                      }
                    }
                    local_110 = (ulong)(iVar31 * -0x1e + 0x780) + sVar56 * 0x87;
                    iVar31 = uVar53 - iVar29;
                    local_140 = (long)(int)uVar30;
                    local_148 = sVar56;
                  }
                }
              }
              bVar15 = true;
              sVar56 = local_148;
            }
          }
        }
      }
LAB_0011512d:
      if (local_110 < 0x7e5) {
        local_f0 = local_f0 + 1;
        uVar44 = position + 1;
        if ((back_refs_position == (size_t *)0x0) && (local_c8 < uVar44)) {
          if ((uint)((int)lVar26 * 4) + local_c8 < uVar44) {
            uVar43 = position + 0x11;
            if (uVar1 <= position + 0x11) {
              uVar43 = uVar1;
            }
            if (uVar44 < uVar43) {
              uVar11 = (params->dictionary).cutoffTransforms;
              puVar12 = (params->dictionary).hash_table_words;
              uVar32._0_4_ = (params->dist).alphabet_size_max;
              uVar32._4_4_ = (params->dist).alphabet_size_limit;
              uVar8 = (params->dist).distance_postfix_bits;
              sVar17 = (params->dist).max_distance;
              uVar9 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
              do {
                uVar52 = (*(ulong *)(ringbuffer + (uVar44 & ringbuffer_mask)) & uVar32) *
                         0x1fe35a7bd3579bd3 >> ((byte)uVar8 & 0x3f);
                uVar40 = uVar52 & 0xffffffff;
                uVar5 = *(ushort *)(uVar11 + uVar40 * 2);
                *(ushort *)(uVar11 + uVar40 * 2) = uVar5 + 1;
                *(int *)(puVar12 +
                        (ulong)((uint)sVar17 & (uint)uVar5) * 2 +
                        (ulong)(uint)((int)uVar52 << ((byte)uVar9 & 0x1f)) * 2) = (int)uVar44;
                local_f0 = local_f0 + 4;
                uVar44 = uVar44 + 4;
              } while (uVar44 < uVar43);
            }
          }
          else {
            uVar43 = position + 9;
            if (uVar1 <= position + 9) {
              uVar43 = uVar1;
            }
            if (uVar44 < uVar43) {
              uVar11 = (params->dictionary).cutoffTransforms;
              puVar12 = (params->dictionary).hash_table_words;
              uVar40._0_4_ = (params->dist).alphabet_size_max;
              uVar40._4_4_ = (params->dist).alphabet_size_limit;
              uVar8 = (params->dist).distance_postfix_bits;
              sVar17 = (params->dist).max_distance;
              uVar9 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
              do {
                uVar52 = (*(ulong *)(ringbuffer + (uVar44 & ringbuffer_mask)) & uVar40) *
                         0x1fe35a7bd3579bd3 >> ((byte)uVar8 & 0x3f);
                uVar32 = uVar52 & 0xffffffff;
                uVar5 = *(ushort *)(uVar11 + uVar32 * 2);
                *(ushort *)(uVar11 + uVar32 * 2) = uVar5 + 1;
                *(int *)(puVar12 +
                        (ulong)((uint)sVar17 & (uint)uVar5) * 2 +
                        (ulong)(uint)((int)uVar52 << ((byte)uVar9 & 0x1f)) * 2) = (int)uVar44;
                local_f0 = local_f0 + 2;
                uVar44 = uVar44 + 2;
              } while (uVar44 < uVar43);
            }
          }
        }
      }
      else {
        if (!bVar15) {
          uVar11 = (params->dictionary).cutoffTransforms;
          puVar12 = (params->dictionary).hash_table_words;
          uVar44 = (lVar3 + num_bytes) - position;
          iVar29 = 0;
          local_d0 = local_140;
LAB_001152d6:
          uVar40 = uVar44 >> 3;
          local_d8 = local_d8 - 1;
          uVar43 = sVar56 - 1;
          if (local_d8 <= sVar56 - 1) {
            uVar43 = local_d8;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            uVar43 = 0;
          }
          uVar32 = position + 1;
          uVar52 = uVar4;
          if (uVar32 < uVar4) {
            uVar52 = uVar32;
          }
          uVar33 = lVar10 + position + 1;
          if (uVar4 <= uVar33) {
            uVar33 = uVar4;
          }
          uVar59 = *(ulong *)(literal_context_lut + 0x50);
          uVar36 = uVar32 & ringbuffer_mask;
          psVar47 = *(size_t **)backward_references;
          bVar60 = psVar47 < back_refs_position;
          if (!bVar60) {
LAB_0011545a:
            uVar58 = (ulong)*(int *)&(params->dictionary).words;
            if (uVar58 != 0) {
              puVar23 = ringbuffer + uVar36;
              uVar38 = (ulong)((uint)local_d8 & 7);
              local_138 = 0x7e4;
              uVar41 = 0;
              local_150 = 0;
              local_148 = 0;
LAB_001154ad:
              uVar48 = (ulong)*(int *)((long)&(hasher->common).extra + uVar41 * 4);
              if (((uVar48 <= uVar52) && (uVar32 - uVar48 < uVar32)) &&
                 (uVar43 + uVar36 <= ringbuffer_mask)) {
                uVar27 = uVar32 - uVar48 & ringbuffer_mask;
                if ((ringbuffer_mask < uVar27 + uVar43) ||
                   (ringbuffer[uVar43 + uVar36] != ringbuffer[uVar27 + uVar43])) goto LAB_0011553f;
                uVar34 = uVar38;
                if (7 < local_d8) {
                  lVar50 = 0;
                  uVar51 = 0;
LAB_00115501:
                  if (*(ulong *)(puVar23 + uVar51 * 8) ==
                      *(ulong *)(ringbuffer + uVar51 * 8 + uVar27)) goto code_r0x00115513;
                  uVar34 = *(ulong *)(ringbuffer + uVar51 * 8 + uVar27) ^
                           *(ulong *)(puVar23 + uVar51 * 8);
                  uVar27 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar51 = (uVar27 >> 3 & 0x1fffffff) - lVar50;
                  goto LAB_00115563;
                }
                uVar51 = 0;
                puVar55 = puVar23;
                goto joined_r0x00115605;
              }
              goto LAB_0011553f;
            }
            local_138 = 0x7e4;
            local_148 = 0;
            local_150 = 0;
LAB_00115647:
            uVar58._0_4_ = (params->dist).alphabet_size_max;
            uVar58._4_4_ = (params->dist).alphabet_size_limit;
            uVar58 = (*(ulong *)(ringbuffer + uVar36) & uVar58) * 0x1fe35a7bd3579bd3 >>
                     ((byte)(params->dist).distance_postfix_bits & 0x3f);
            uVar41 = uVar58 & 0xffffffff;
            uVar30 = (int)uVar58 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
            puVar23 = ringbuffer + uVar36;
            uVar5 = *(ushort *)(uVar11 + uVar41 * 2);
            uVar38 = (ulong)uVar5;
            piVar37 = &(params->hasher).num_last_distances_to_check;
            uVar58 = 0;
            if (*(ulong *)piVar37 <= uVar38) {
              uVar58 = uVar38 - *(long *)piVar37;
            }
            uVar48 = (ulong)((uint)local_d8 & 7);
LAB_001156d5:
            if (uVar58 < uVar38) {
              uVar38 = uVar38 - 1;
              uVar53 = *(uint *)(puVar12 +
                                (ulong)uVar30 * 2 +
                                (ulong)((uint)(params->dist).max_distance & (uint)uVar38) * 2);
              uVar27 = uVar32 - uVar53;
              if ((uVar27 <= uVar52) && (uVar43 + uVar36 <= ringbuffer_mask)) {
                uVar34 = (ulong)(uVar53 & (uint)ringbuffer_mask);
                if ((ringbuffer_mask < uVar34 + uVar43) ||
                   (ringbuffer[uVar43 + uVar36] != ringbuffer[uVar34 + uVar43])) goto LAB_001157e0;
                uVar51 = uVar48;
                if (7 < local_d8) {
                  lVar50 = 0;
                  uVar42 = 0;
LAB_00115744:
                  if (*(ulong *)(puVar23 + uVar42 * 8) ==
                      *(ulong *)(ringbuffer + uVar42 * 8 + uVar34)) goto code_r0x00115756;
                  uVar51 = *(ulong *)(ringbuffer + uVar42 * 8 + uVar34) ^
                           *(ulong *)(puVar23 + uVar42 * 8);
                  uVar34 = 0;
                  if (uVar51 != 0) {
                    for (; (uVar51 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar42 = (uVar34 >> 3 & 0x1fffffff) - lVar50;
                  goto LAB_00115785;
                }
                uVar42 = 0;
                puVar55 = puVar23;
                goto joined_r0x001157fe;
              }
              goto LAB_001157e0;
            }
            goto LAB_0011581d;
          }
          if ((ulong)(long)(int)num_literals[(long)psVar47 * 2] < uVar32) {
            psVar46 = num_literals + (long)psVar47 * 2 + 2;
            do {
              psVar47 = (size_t *)((long)psVar47 + 1);
              if (back_refs_position == psVar47) {
                *(size_t **)backward_references = psVar47;
                bVar60 = false;
                psVar47 = back_refs_position;
                goto LAB_0011545a;
              }
              sVar17 = *psVar46;
              psVar46 = psVar46 + 2;
            } while ((ulong)(long)(int)sVar17 < uVar32);
            *(size_t **)backward_references = psVar47;
            bVar60 = psVar47 < back_refs_position;
          }
          if ((!bVar60) || (uVar32 != (long)(int)num_literals[(long)psVar47 * 2]))
          goto LAB_0011545a;
          uVar30 = (uint)num_literals[(long)psVar47 * 2 + 1];
          local_148 = (size_t)(int)uVar30;
          local_138 = 0x7e4;
          iVar19 = 0;
          bVar16 = true;
          if ((uVar32 - local_148 < uVar32) &&
             (uVar30 <= *(uint *)((long)num_literals + (long)psVar47 * 0x10 + 0xc))) {
            uVar43 = uVar32 - local_148 & ringbuffer_mask;
            puVar23 = ringbuffer + uVar36;
            if (7 < local_d8) {
              lVar50 = 0;
              uVar58 = 0;
LAB_00115cc7:
              if (*(ulong *)(puVar23 + uVar58 * 8) == *(ulong *)(ringbuffer + uVar58 * 8 + uVar43))
              goto code_r0x00115cd4;
              uVar40 = *(ulong *)(ringbuffer + uVar58 * 8 + uVar43) ^
                       *(ulong *)(puVar23 + uVar58 * 8);
              uVar43 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar40 = (uVar43 >> 3 & 0x1fffffff) - lVar50;
              goto LAB_00115d00;
            }
            uVar40 = 0;
            goto LAB_00115dae;
          }
          bVar15 = false;
          local_148 = 0;
          local_150 = 0;
          goto LAB_00115d42;
        }
LAB_00115167:
        uVar44 = position + lVar10;
        if (uVar4 <= position + lVar10) {
          uVar44 = uVar4;
        }
        if (uVar44 < local_140) {
LAB_001161e0:
          uVar43 = local_140 + 0xf;
        }
        else {
          uVar43 = (ulong)*(int *)&(hasher->common).extra;
          uVar30 = 0;
          bVar60 = false;
          if (local_140 != uVar43) {
            uVar40 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
            if (local_140 == uVar40) {
              uVar30 = 1;
            }
            else {
              uVar43 = (local_140 + 3) - uVar43;
              if (uVar43 < 7) {
                bVar25 = (byte)((int)uVar43 << 2);
                uVar30 = 0x9750468;
              }
              else {
                uVar40 = (local_140 + 3) - uVar40;
                if (6 < uVar40) {
                  if (local_140 != (long)(int)(hasher->common).dict_num_lookups) {
                    bVar60 = local_140 !=
                             (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
                    uVar30 = 3;
                    goto LAB_001161dc;
                  }
                  uVar30 = 2;
                  goto LAB_001161da;
                }
                bVar25 = (byte)((int)uVar40 << 2);
                uVar30 = 0xfdb1ace;
              }
              uVar30 = uVar30 >> (bVar25 & 0x1f) & 0xf;
            }
LAB_001161da:
            bVar60 = false;
          }
LAB_001161dc:
          if (bVar60) goto LAB_001161e0;
          uVar43 = (ulong)uVar30;
        }
        if ((local_140 <= uVar44) && (uVar43 != 0)) {
          (hasher->common).dict_num_lookups = *(size_t *)((long)&(hasher->common).extra + 4);
          iVar29 = *(int *)&(hasher->common).extra;
          *(int *)((long)&(hasher->common).extra + 4) = iVar29;
          iVar45 = (int)local_140;
          *(int *)&(hasher->common).extra = iVar45;
          iVar19 = *(int *)&(params->dictionary).words;
          if (4 < iVar19) {
            *(int *)&(hasher->common).dict_num_matches = iVar45 + -1;
            *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar45 + 1;
            (hasher->common).params.type = iVar45 + -2;
            (hasher->common).params.bucket_bits = iVar45 + 2;
            (hasher->common).params.block_bits = iVar45 + -3;
            (hasher->common).params.hash_len = iVar45 + 3;
            if (10 < iVar19) {
              (hasher->common).params.num_last_distances_to_check = iVar29 + -1;
              (hasher->common).is_prepared_ = iVar29 + 1;
              *(int *)&hasher->privat = iVar29 + -2;
              *(int *)((long)&hasher->privat + 4) = iVar29 + 2;
              *(int *)((long)&hasher->privat + 8) = iVar29 + -3;
              *(int *)((long)&hasher->privat + 0xc) = iVar29 + 3;
            }
          }
        }
        uVar30 = (uint)local_f0;
        *(uint *)local_b0 = uVar30;
        *(uint *)((long)local_b0 + 4) = iVar31 << 0x19 | (uint)sVar56;
        uVar44 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
        if (uVar43 < uVar44) {
          *(short *)((long)local_b0 + 0xe) = (short)uVar43;
          uVar53 = 0;
        }
        else {
          bVar25 = (byte)*(int *)(literal_context_lut + 0x40);
          uVar43 = ((uVar43 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar25 & 0x3f))) -
                   0x10;
          uVar53 = 0x1f;
          if ((uint)uVar43 != 0) {
            for (; (uint)uVar43 >> uVar53 == 0; uVar53 = uVar53 - 1) {
            }
          }
          uVar53 = (uVar53 ^ 0xffffffe0) + 0x1f;
          bVar60 = (uVar43 >> ((ulong)uVar53 & 0x3f) & 1) != 0;
          iVar29 = uVar53 - *(int *)(literal_context_lut + 0x40);
          *(ushort *)((long)local_b0 + 0xe) =
               (short)((uint)bVar60 + iVar29 * 2 + 0xfffe << (bVar25 & 0x3f)) +
               (short)uVar44 + (~(ushort)(-1 << (bVar25 & 0x1f)) & (ushort)uVar43) |
               (short)iVar29 * 0x400;
          uVar53 = (uint)(uVar43 - ((ulong)bVar60 + 2 << ((byte)uVar53 & 0x3f)) >> (bVar25 & 0x3f));
        }
        *(uint *)(local_b0 + 1) = uVar53;
        if (5 < local_f0) {
          if (local_f0 < 0x82) {
            uVar30 = 0x1f;
            uVar53 = (uint)(local_f0 - 2);
            if (uVar53 != 0) {
              for (; uVar53 >> uVar30 == 0; uVar30 = uVar30 - 1) {
              }
            }
            uVar30 = (int)(local_f0 - 2 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar30 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_f0 < 0x842) {
            uVar53 = 0x1f;
            if (uVar30 - 0x42 != 0) {
              for (; uVar30 - 0x42 >> uVar53 == 0; uVar53 = uVar53 - 1) {
              }
            }
            uVar30 = (uVar53 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar30 = 0x15;
            if (0x1841 < local_f0) {
              uVar30 = (uint)(ushort)(0x17 - (local_f0 < 0x5842));
            }
          }
        }
        uVar53 = iVar31 + (uint)sVar56;
        if (uVar53 < 10) {
          uVar54 = uVar53 - 2;
        }
        else if (uVar53 < 0x86) {
          uVar53 = uVar53 - 6;
          uVar54 = 0x1f;
          if (uVar53 != 0) {
            for (; uVar53 >> uVar54 == 0; uVar54 = uVar54 - 1) {
            }
          }
          uVar54 = (int)((ulong)(long)(int)uVar53 >> ((char)(uVar54 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar54 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar54 = 0x17;
          if (uVar53 < 0x846) {
            uVar54 = 0x1f;
            if (uVar53 - 0x46 != 0) {
              for (; uVar53 - 0x46 >> uVar54 == 0; uVar54 = uVar54 - 1) {
              }
            }
            uVar54 = (uVar54 ^ 0xffe0) + 0x2c;
          }
        }
        uVar5 = (ushort)uVar54;
        uVar39 = (uVar5 & 7) + ((ushort)uVar30 & 7) * 8;
        if ((((*(ushort *)((long)local_b0 + 0xe) & 0x3ff) == 0) && ((ushort)uVar30 < 8)) &&
           (uVar5 < 0x10)) {
          if (7 < uVar5) {
            uVar39 = uVar39 | 0x40;
          }
        }
        else {
          iVar31 = ((uVar30 & 0xffff) >> 3) * 3 + ((uVar54 & 0xffff) >> 3);
          uVar39 = uVar39 + ((ushort)(0x520d40 >> ((char)iVar31 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar31 * 0x40 + 0x40;
        }
        *(ushort *)((long)local_b0 + 0xc) = uVar39;
        *num_commands = *num_commands + local_f0;
        uVar44 = position + sVar56;
        uVar43 = uVar20;
        if (uVar44 < uVar20) {
          uVar43 = uVar44;
        }
        uVar40 = position + 2;
        if (local_140 < sVar56 >> 2) {
          uVar32 = uVar44 + local_140 * -4;
          if (uVar32 < uVar40) {
            uVar32 = uVar40;
          }
          uVar40 = uVar32;
          if (uVar43 < uVar32) {
            uVar40 = uVar43;
          }
        }
        local_c8 = lVar26 + sVar56 * 2 + position;
        local_b0 = local_b0 + 2;
        if (uVar40 < uVar43) {
          uVar11 = (params->dictionary).cutoffTransforms;
          puVar12 = (params->dictionary).hash_table_words;
          uVar33._0_4_ = (params->dist).alphabet_size_max;
          uVar33._4_4_ = (params->dist).alphabet_size_limit;
          uVar8 = (params->dist).distance_postfix_bits;
          sVar17 = (params->dist).max_distance;
          uVar9 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar52 = (*(ulong *)(ringbuffer + (uVar40 & ringbuffer_mask)) & uVar33) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar8 & 0x3f);
            uVar32 = uVar52 & 0xffffffff;
            uVar5 = *(ushort *)(uVar11 + uVar32 * 2);
            *(ushort *)(uVar11 + uVar32 * 2) = uVar5 + 1;
            *(int *)(puVar12 +
                    (ulong)((uint)sVar17 & (uint)uVar5) * 2 +
                    (ulong)(uint)((int)uVar52 << ((byte)uVar9 & 0x1f)) * 2) = (int)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar43 != uVar40);
        }
        local_f0 = 0;
      }
      position = uVar44;
    } while (position + 8 < uVar2);
  }
  else {
    local_b0 = last_insert_len;
  }
  *(ulong *)dist_cache = (local_f0 + uVar2) - position;
  *(long *)commands = *(long *)commands + ((long)local_b0 - (long)last_insert_len >> 4);
  return;
code_r0x00114bd9:
  uVar41 = uVar41 + 1;
  lVar50 = lVar50 + -8;
  uVar48 = local_d8 & 0xfffffffffffffff8;
  puVar55 = puVar23 + (local_d8 & 0xfffffffffffffff8);
  if (local_d8 >> 3 == uVar41) goto LAB_00114cec;
  goto LAB_00114bc4;
code_r0x00114e7e:
  uVar48 = uVar48 + 1;
  lVar50 = lVar50 + -8;
  puVar55 = puVar23 + (local_d8 & 0xfffffffffffffff8);
  uVar27 = local_d8 & 0xfffffffffffffff8;
  if (local_d8 >> 3 == uVar48) goto LAB_00114f45;
  goto LAB_00114e69;
code_r0x001160fb:
  uVar59 = uVar59 + 1;
  lVar50 = lVar50 + -8;
  if (local_d8 >> 3 == uVar59) goto LAB_001165ec;
  goto LAB_001160ee;
code_r0x00115f56:
  uVar33 = uVar33 + 1;
  lVar57 = lVar57 + -8;
  if (bVar25 >> 3 == uVar33) goto code_r0x00115f62;
  goto LAB_00115f44;
code_r0x00115f62:
  pcVar28 = pcVar28 + -lVar57;
LAB_00116063:
  uVar59 = uVar32 & 7;
  uVar33 = sVar56;
  if ((bVar25 & 7) != 0) {
    uVar36 = sVar56 | uVar59;
    do {
      uVar33 = sVar56;
      if (*(char *)((long)piVar37 + sVar56) != *pcVar28) break;
      pcVar28 = pcVar28 + 1;
      sVar56 = sVar56 + 1;
      uVar59 = uVar59 - 1;
      uVar33 = uVar36;
    } while (uVar59 != 0);
  }
LAB_00115f94:
  if (((uVar33 == 0) || (*(uint *)(literal_context_lut + 100) + uVar33 <= uVar32)) ||
     (uVar32 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar32 - uVar33) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar32 - uVar33) * 4 << (*(byte *)(lVar14 + uVar32) & 0x3f)) + uVar52 + uVar43 + 1,
     uVar40 < uVar32)) {
    bVar60 = true;
  }
  else {
    iVar29 = 0x1f;
    if ((uint)uVar32 != 0) {
      for (; (uint)uVar32 >> iVar29 == 0; iVar29 = iVar29 + -1) {
      }
    }
    uVar52 = (uVar33 * 0x87 - (ulong)(uint)(iVar29 * 0x1e)) + 0x780;
    bVar60 = true;
    if (local_110 <= uVar52) {
      iVar31 = (uint)bVar25 - (int)uVar33;
      bVar60 = false;
      local_148 = uVar33;
      local_140 = uVar32;
      local_110 = uVar52;
    }
  }
LAB_00115fed:
  if (!bVar60) {
    *(long *)(lVar50 + 0x10) = *(long *)(lVar50 + 0x10) + 1;
  }
LAB_00115ffd:
  uVar44 = uVar44 + 1;
  bVar60 = lVar35 != 0;
  lVar35 = lVar35 + 1;
  sVar56 = local_148;
  if (bVar60) goto LAB_0011512d;
  goto LAB_00115ed1;
code_r0x00115513:
  uVar51 = uVar51 + 1;
  lVar50 = lVar50 + -8;
  if (uVar40 == uVar51) goto code_r0x00115524;
  goto LAB_00115501;
code_r0x00115524:
  uVar51 = -lVar50;
  puVar55 = puVar23 + -lVar50;
joined_r0x00115605:
  for (; (uVar34 != 0 && (ringbuffer[uVar51 + uVar27] == *puVar55)); uVar51 = uVar51 + 1) {
    uVar34 = uVar34 - 1;
    puVar55 = puVar55 + 1;
  }
LAB_00115563:
  if ((bVar60) && ((ulong)(long)(int)num_literals[(long)psVar47 * 2] < uVar51 + uVar32)) {
    uVar51 = (long)(int)num_literals[(long)psVar47 * 2] - uVar32;
  }
  if (((2 < uVar51) || ((uVar41 < 2 && (uVar51 == 2)))) &&
     (uVar27 = uVar51 * 0x87 + 0x78f, local_138 < uVar27)) {
    if (uVar41 != 0) {
      uVar27 = uVar27 - ((0x1ca10U >> ((byte)uVar41 & 0xe) & 0xe) + 0x27);
    }
    if (local_138 < uVar27) {
      uVar43 = uVar51;
      local_150 = uVar51;
      local_148 = uVar48;
      local_138 = uVar27;
    }
  }
LAB_0011553f:
  uVar41 = uVar41 + 1;
  if (uVar41 == uVar58) goto LAB_00115647;
  goto LAB_001154ad;
code_r0x00115756:
  uVar42 = uVar42 + 1;
  lVar50 = lVar50 + -8;
  if (uVar40 == uVar42) goto code_r0x00115767;
  goto LAB_00115744;
code_r0x00115767:
  uVar42 = -lVar50;
  puVar55 = puVar23 + -lVar50;
joined_r0x001157fe:
  for (; (uVar51 != 0 && (ringbuffer[uVar42 + uVar34] == *puVar55)); uVar42 = uVar42 + 1) {
    uVar51 = uVar51 - 1;
    puVar55 = puVar55 + 1;
  }
LAB_00115785:
  if ((bVar60) && ((ulong)(long)(int)num_literals[(long)psVar47 * 2] < uVar42 + uVar32)) {
    uVar42 = (long)(int)num_literals[(long)psVar47 * 2] - uVar32;
  }
  if (3 < uVar42) {
    iVar19 = 0x1f;
    if ((uint)uVar27 != 0) {
      for (; (uint)uVar27 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar34 = (ulong)(iVar19 * -0x1e + 0x780) + uVar42 * 0x87;
    if (local_138 < uVar34) {
      uVar43 = uVar42;
      local_150 = uVar42;
      local_148 = uVar27;
      local_138 = uVar34;
    }
  }
LAB_001157e0:
  if (uVar52 < uVar27) goto LAB_0011581d;
  goto LAB_001156d5;
LAB_0011581d:
  *(int *)(puVar12 +
          (ulong)uVar30 * 2 + (ulong)((uint)(params->dist).max_distance & (uint)uVar5) * 2) =
       (int)uVar32;
  *(ushort *)(uVar11 + uVar41 * 2) = uVar5 + 1;
  bVar15 = false;
  goto LAB_00115852;
code_r0x00115cd4:
  uVar58 = uVar58 + 1;
  lVar50 = lVar50 + -8;
  if (uVar40 == uVar58) goto code_r0x00115ce5;
  goto LAB_00115cc7;
code_r0x00115ce5:
  puVar23 = puVar23 + -lVar50;
  uVar40 = -lVar50;
LAB_00115dae:
  uVar58 = local_d8 & 7;
  for (; (uVar58 != 0 && (ringbuffer[uVar40 + uVar43] == *puVar23)); uVar40 = uVar40 + 1) {
    puVar23 = puVar23 + 1;
    uVar58 = uVar58 - 1;
  }
LAB_00115d00:
  local_150 = (size_t)*(int *)((long)num_literals + (long)psVar47 * 0x10 + 4);
  if (uVar40 < local_150) {
    local_150 = uVar40;
  }
  iVar45 = 0x1f;
  if (uVar30 != 0) {
    for (; uVar30 >> iVar45 == 0; iVar45 = iVar45 + -1) {
    }
  }
  local_138 = (ulong)(iVar45 * -0x1e + 0x780) + local_150 * 0x87;
  bVar15 = true;
  bVar16 = false;
LAB_00115d42:
  if (!bVar16) goto LAB_00115bc8;
LAB_00115852:
  iVar19 = 0;
  if (local_138 == 0x7e4) {
    if (back_refs_position == (size_t *)0x0) {
      lVar50 = *(long *)&(params->dictionary).num_transforms;
      if (*(ulong *)(lVar50 + 8) >> 7 <= *(ulong *)(lVar50 + 0x10)) {
        piVar37 = (int *)(ringbuffer + uVar36);
        uVar43 = (ulong)((uint)(*piVar37 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar13 = *(long *)(literal_context_lut + 0x78);
        lVar49 = *(long *)(lVar50 + 8);
        iVar19 = 0;
        lVar35 = 0;
LAB_001159f5:
        lVar49 = lVar49 + 1;
        *(long *)(lVar50 + 8) = lVar49;
        bVar25 = *(byte *)(lVar13 + uVar43);
        uVar40 = (ulong)bVar25;
        if (uVar40 != 0) {
          bVar60 = true;
          if (uVar40 <= local_d8) {
            uVar52 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar43 * 2);
            lVar14 = *(long *)(literal_context_lut + 0x58);
            pcVar28 = (char *)(uVar52 * uVar40 + *(long *)(lVar14 + 0xa8) +
                              (ulong)*(uint *)(lVar14 + 0x20 + uVar40 * 4));
            if (7 < bVar25) {
              sVar24 = (size_t)(bVar25 & 0xfffffff8);
              lVar57 = 0;
              uVar36 = 0;
LAB_00115a60:
              if (*(ulong *)(pcVar28 + uVar36 * 8) == *(ulong *)(piVar37 + uVar36 * 2))
              goto code_r0x00115a6d;
              uVar58 = *(ulong *)(piVar37 + uVar36 * 2) ^ *(ulong *)(pcVar28 + uVar36 * 8);
              uVar36 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar36 = (uVar36 >> 3 & 0x1fffffff) - lVar57;
              goto LAB_00115ab0;
            }
            sVar24 = 0;
            goto LAB_00115b89;
          }
          goto LAB_00115b09;
        }
        goto LAB_00115b1e;
      }
    }
    else if ((bVar60) && (uVar32 == (long)(int)num_literals[(long)psVar47 * 2])) {
      uVar30 = (uint)num_literals[(long)psVar47 * 2 + 1];
      if (*(int *)((long)num_literals + (long)psVar47 * 0x10 + 0xc) < (int)uVar30) {
        uVar53 = *(uint *)((long)num_literals + (long)psVar47 * 0x10 + 4);
        uVar43 = (ulong)uVar53;
        if (uVar53 - 4 < 0x15 && (int)uVar30 < 0x7ffffffd) {
          uVar54 = ~(uint)uVar52 + uVar30;
          lVar50 = *(long *)(literal_context_lut + 0x58);
          iVar45 = (int)uVar54 >> (*(byte *)(lVar50 + uVar43) & 0x1f);
          if (iVar45 < *(int *)(literal_context_lut + 0x60)) {
            uVar6 = *(uint *)(lVar50 + 0x20 + uVar43 * 4);
            uVar7 = kBitMask[*(byte *)(lVar50 + uVar43)];
            lVar50 = *(long *)(lVar50 + 0xa8);
            pBVar22 = BrotliGetTransforms();
            puVar23 = (uint8_t *)malloc(uVar43 * 10);
            iVar45 = BrotliTransformDictionaryWord
                               (puVar23,(uint8_t *)
                                        ((ulong)uVar6 + lVar50 +
                                        (long)(int)((uVar54 & uVar7) * uVar53)),uVar53,pBVar22,
                                iVar45);
            sVar24 = (size_t)iVar45;
            iVar18 = bcmp(ringbuffer + uVar36,puVar23,sVar24);
            if (iVar18 == 0) {
              iVar19 = 0x1f;
              if (uVar30 != 0) {
                for (; uVar30 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                }
              }
              local_138 = (ulong)(iVar19 * -0x1e + 0x780) + sVar24 * 0x87;
              iVar19 = uVar53 - iVar45;
              local_148 = (long)(int)uVar30;
              local_150 = sVar24;
            }
          }
        }
        bVar15 = true;
      }
    }
  }
LAB_00115bc8:
  bVar60 = true;
  if ((bVar15) || (local_140 = local_d0, local_110 + 0xaf <= local_138)) {
    local_f0 = local_f0 + 1;
    bVar60 = (2 < iVar29 || bVar15) || uVar2 <= position + 9;
    local_110 = local_138;
    sVar56 = local_150;
    local_140 = local_148;
    position = uVar32;
    iVar29 = iVar29 + 1;
    iVar31 = iVar19;
  }
  uVar44 = uVar44 - 1;
  local_d0 = local_140;
  if (bVar60) goto LAB_00115167;
  goto LAB_001152d6;
code_r0x00115a6d:
  uVar36 = uVar36 + 1;
  lVar57 = lVar57 + -8;
  if (bVar25 >> 3 == uVar36) goto code_r0x00115a79;
  goto LAB_00115a60;
code_r0x00115a79:
  pcVar28 = pcVar28 + -lVar57;
LAB_00115b89:
  uVar58 = uVar40 & 7;
  uVar36 = sVar24;
  if ((bVar25 & 7) != 0) {
    uVar38 = sVar24 | uVar58;
    do {
      uVar36 = sVar24;
      if (*(char *)((long)piVar37 + sVar24) != *pcVar28) break;
      pcVar28 = pcVar28 + 1;
      sVar24 = sVar24 + 1;
      uVar58 = uVar58 - 1;
      uVar36 = uVar38;
    } while (uVar58 != 0);
  }
LAB_00115ab0:
  if (((uVar36 == 0) || (*(uint *)(literal_context_lut + 100) + uVar36 <= uVar40)) ||
     (uVar40 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar40 - uVar36) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar40 - uVar36) * 4 << (*(byte *)(lVar14 + uVar40) & 0x3f)) + uVar52 + uVar33 + 1,
     uVar59 < uVar40)) {
    bVar60 = true;
  }
  else {
    iVar45 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar45 == 0; iVar45 = iVar45 + -1) {
      }
    }
    uVar52 = (uVar36 * 0x87 - (ulong)(uint)(iVar45 * 0x1e)) + 0x780;
    bVar60 = true;
    if (local_138 <= uVar52) {
      iVar19 = (uint)bVar25 - (int)uVar36;
      bVar60 = false;
      local_150 = uVar36;
      local_148 = uVar40;
      local_138 = uVar52;
    }
  }
LAB_00115b09:
  if (!bVar60) {
    *(long *)(lVar50 + 0x10) = *(long *)(lVar50 + 0x10) + 1;
  }
LAB_00115b1e:
  uVar43 = uVar43 + 1;
  bVar60 = lVar35 != 0;
  lVar35 = lVar35 + 1;
  if (bVar60) goto LAB_00115bc8;
  goto LAB_001159f5;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}